

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::UnsafeArenaReleaseMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  Message *pMVar1;
  bool bVar2;
  CppType CVar3;
  uint32 uVar4;
  MessageLite *pMVar5;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x50] != (FieldDescriptor)0x1) {
    if ((*(int *)(field + 0x4c) != 3) && (*(long *)(field + 0x60) == 0)) {
      ClearBit(this,message,field);
    }
    if (*(long *)(field + 0x60) != 0) {
      bVar2 = HasOneofField(this,message,field);
      if (!bVar2) {
        return (Message *)0x0;
      }
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((*(long *)(field + 0x60) -
                           *(long *)(*(long *)(*(long *)(field + 0x60) + 0x10) + 0x40)) / 0x30) * 4
                    + (this->schema_).oneof_case_offset_)) = 0;
    }
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    pMVar1 = *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = 0;
    return pMVar1;
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  uVar4 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  pMVar5 = ExtensionSet::UnsafeArenaReleaseMessage
                     ((ExtensionSet *)
                      ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),field,
                      factory);
  return (Message *)pMVar5;
}

Assistant:

Message* GeneratedMessageReflection::UnsafeArenaReleaseMessage(
    Message* message,
    const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || field->containing_oneof())) {
      ClearBit(message, field);
    }
    if (field->containing_oneof()) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return NULL;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = NULL;
    return ret;
  }
}